

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpMakeHttpRequest(Upnp_HttpMethod method,char *url,void *handle,UpnpString *headers,
                       char *contentType,int contentLength,int timeout)

{
  int iVar1;
  int contentLength_local;
  char *contentType_local;
  UpnpString *headers_local;
  void *handle_local;
  char *url_local;
  Upnp_HttpMethod method_local;
  
  iVar1 = http_MakeHttpRequest(method,url,handle,headers,contentType,contentLength,timeout);
  return iVar1;
}

Assistant:

int UpnpMakeHttpRequest(Upnp_HttpMethod method,
	const char *url,
	void *handle,
	UpnpString *headers,
	const char *contentType,
	int contentLength,
	int timeout)
{
	return http_MakeHttpRequest(method,
		url,
		handle,
		headers,
		contentType,
		contentLength,
		timeout);
}